

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGjkEpa2.cpp
# Opt level: O1

btScalar __thiscall
btGjkEpaSolver2::SignedDistance
          (btGjkEpaSolver2 *this,btVector3 *position,btScalar margin,btConvexShape *shape0,
          btTransform *wtrs0,sResults *results)

{
  undefined8 uVar1;
  void *pvVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  bool bVar8;
  _ _Var9;
  code *pcVar10;
  ulong uVar11;
  long *plVar12;
  float fVar13;
  btScalar bVar14;
  btScalar bVar15;
  undefined8 uVar16;
  float in_XMM1_Da;
  float fVar17;
  float in_XMM1_Db;
  float in_XMM1_Dc;
  float in_XMM1_Dd;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  btVector3 bVar22;
  btSphereShape shape1;
  btTransform wtrs1;
  tShape shape;
  GJK gjk;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  undefined1 local_378 [8];
  float fStack_370;
  float fStack_36c;
  btVector3 local_348;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  btConvexInternalShape local_320;
  btTransform local_2d8;
  tShape local_298;
  GJK local_208;
  
  btConvexInternalShape::btConvexInternalShape(&local_320);
  local_320.super_btConvexShape.super_btCollisionShape._vptr_btCollisionShape =
       (_func_int **)&PTR__btConvexShape_00226830;
  local_320.super_btConvexShape.super_btCollisionShape.m_shapeType = 8;
  local_208.m_shape.m_shapes[0] = (btConvexShape *)0x0;
  local_208.m_shape.m_shapes[1] = (btConvexShape *)0x3f80000000000000;
  local_320.m_implicitShapeDimensions.m_floats[0] = margin;
  local_320.m_collisionMargin = margin;
  btMatrix3x3::setRotation(&local_2d8.m_basis,(btQuaternion *)&local_208);
  local_2d8.m_origin.m_floats._0_8_ = *(undefined8 *)this;
  local_2d8.m_origin.m_floats._8_8_ = *(undefined8 *)(this + 8);
  gjkepa2_impl::Initialize
            ((btConvexShape *)position,(btTransform *)shape0,&local_320.super_btConvexShape,
             &local_2d8,(sResults *)wtrs0,&local_298,false);
  local_208.m_nfree = 0;
  local_208.m_current = 0;
  local_208.m_ray.m_floats[0] = 0.0;
  local_208.m_ray.m_floats[1] = 0.0;
  local_208.m_ray.m_floats[2] = 0.0;
  local_208.m_ray.m_floats[3] = 0.0;
  local_208.m_status = Failed;
  local_208.m_distance = 0.0;
  local_348.m_floats[2] = 1.0;
  local_348.m_floats[3] = 0.0;
  local_348.m_floats[0] = 1.0;
  local_348.m_floats[1] = 1.0;
  _Var9 = gjkepa2_impl::GJK::Evaluate(&local_208,&local_298,&local_348);
  fVar18 = 3.4028235e+38;
  if (_Var9 == Inside) {
    bVar8 = Penetration((btConvexShape *)position,(btTransform *)shape0,
                        &local_320.super_btConvexShape,&local_2d8,&local_208.m_ray,(sResults *)wtrs0
                        ,true);
    if (bVar8) {
      uVar16 = *(undefined8 *)((wtrs0->m_basis).m_el[0].m_floats + 1);
      uVar1 = *(undefined8 *)((wtrs0->m_basis).m_el[1].m_floats + 1);
      fVar13 = (float)uVar16 - (float)uVar1;
      fVar19 = (float)((ulong)uVar16 >> 0x20) - (float)((ulong)uVar1 >> 0x20);
      fVar20 = (wtrs0->m_basis).m_el[0].m_floats[3] - (wtrs0->m_basis).m_el[1].m_floats[3];
      fVar18 = fVar20 * fVar20 + fVar13 * fVar13 + fVar19 * fVar19;
      if (fVar18 < 0.0) {
        fVar18 = sqrtf(fVar18);
      }
      else {
        fVar18 = SQRT(fVar18);
      }
      if (1.1920929e-07 <= fVar18) {
        fVar21 = 1.0 / fVar18;
        auVar7._4_4_ = fVar19 * fVar21;
        auVar7._0_4_ = fVar13 * fVar21;
        auVar7._8_4_ = fVar20 * fVar21;
        auVar7._12_4_ = 0;
        *(undefined1 (*) [16])((wtrs0->m_basis).m_el[2].m_floats + 1) = auVar7;
      }
      fVar18 = -fVar18;
    }
  }
  else if (_Var9 == Valid) {
    if ((local_208.m_simplex)->rank == 0) {
      local_378._4_4_ = 0.0;
      local_378._0_4_ = 0.0;
      in_XMM1_Da = 0.0;
      in_XMM1_Db = 0.0;
      in_XMM1_Dc = 0.0;
      in_XMM1_Dd = 0.0;
    }
    else {
      local_388 = 0.0;
      fStack_384 = 0.0;
      fStack_380 = 0.0;
      fStack_37c = 0.0;
      uVar11 = 0;
      _local_378 = ZEXT816(0);
      do {
        plVar12 = (long *)((long)&(local_298.m_shapes[0]->super_btCollisionShape).
                                  _vptr_btCollisionShape + local_298._136_8_);
        pcVar10 = (code *)local_298.Ls;
        if ((local_298.Ls & 1) != 0) {
          pcVar10 = *(code **)(local_298.Ls + *plVar12 + -1);
        }
        fVar18 = (local_208.m_simplex)->p[uVar11];
        uVar16 = (*pcVar10)(plVar12,(local_208.m_simplex)->c[uVar11]);
        uVar3 = *(ulong *)((local_208.m_simplex)->c[uVar11]->d).m_floats ^ 0x8000000080000000;
        local_348.m_floats[2] = -((local_208.m_simplex)->c[uVar11]->d).m_floats[2];
        local_348.m_floats[0] = (btScalar)(int)uVar3;
        local_348.m_floats[1] = (btScalar)(int)(uVar3 >> 0x20);
        local_348.m_floats[3] = 0.0;
        local_338 = in_XMM1_Da;
        fStack_334 = in_XMM1_Db;
        fStack_330 = in_XMM1_Dc;
        fStack_32c = in_XMM1_Dd;
        bVar22 = gjkepa2_impl::MinkowskiDiff::Support(&local_298,&local_348,1);
        local_378._0_4_ = (float)local_378._0_4_ + local_338 * fVar18;
        local_378._4_4_ = (float)local_378._4_4_ + (float)((ulong)uVar16 >> 0x20) * fVar18;
        fStack_370 = fStack_370 + fStack_330 * fVar18;
        fStack_36c = fStack_36c + fStack_32c * fVar18;
        in_XMM1_Da = local_388 + bVar22.m_floats[0] * fVar18;
        in_XMM1_Db = fStack_384 + bVar22.m_floats[1] * fVar18;
        in_XMM1_Dc = fStack_380 + bVar22.m_floats[2] * fVar18;
        in_XMM1_Dd = fStack_37c + (float)uVar16 * fVar18;
        uVar11 = uVar11 + 1;
        local_388 = in_XMM1_Da;
        fStack_384 = in_XMM1_Db;
        fStack_380 = in_XMM1_Dc;
        fStack_37c = in_XMM1_Dd;
      } while (uVar11 < (local_208.m_simplex)->rank);
    }
    pvVar2 = shape0[1].super_btCollisionShape.m_userPointer;
    fVar18 = SUB84(pvVar2,0) +
             (float)(shape0->super_btCollisionShape).m_shapeType * (float)local_378._0_4_ +
             *(float *)&(shape0->super_btCollisionShape)._vptr_btCollisionShape * in_XMM1_Dd +
             *(float *)((long)&(shape0->super_btCollisionShape)._vptr_btCollisionShape + 4) *
             (float)local_378._4_4_;
    fVar19 = (float)((ulong)pvVar2 >> 0x20) +
             (float)(shape0->super_btCollisionShape).m_userIndex * (float)local_378._0_4_ +
             *(float *)&(shape0->super_btCollisionShape).m_userPointer * in_XMM1_Dd +
             *(float *)((long)&(shape0->super_btCollisionShape).m_userPointer + 4) *
             (float)local_378._4_4_;
    auVar5._4_4_ = fVar19;
    auVar5._0_4_ = fVar18;
    auVar5._8_4_ = (float)shape0[1].super_btCollisionShape.m_shapeType * (float)local_378._0_4_ +
                   *(float *)&shape0[1].super_btCollisionShape._vptr_btCollisionShape * in_XMM1_Dd +
                   *(float *)((long)&shape0[1].super_btCollisionShape._vptr_btCollisionShape + 4) *
                   (float)local_378._4_4_ + (float)shape0[1].super_btCollisionShape.m_userIndex;
    auVar5._12_4_ = 0;
    *(undefined1 (*) [16])((wtrs0->m_basis).m_el[0].m_floats + 1) = auVar5;
    pvVar2 = shape0[1].super_btCollisionShape.m_userPointer;
    fVar20 = SUB84(pvVar2,0) +
             (float)(shape0->super_btCollisionShape).m_shapeType * in_XMM1_Dc +
             *(float *)&(shape0->super_btCollisionShape)._vptr_btCollisionShape * in_XMM1_Da +
             *(float *)((long)&(shape0->super_btCollisionShape)._vptr_btCollisionShape + 4) *
             in_XMM1_Db;
    fVar21 = (float)((ulong)pvVar2 >> 0x20) +
             (float)(shape0->super_btCollisionShape).m_userIndex * in_XMM1_Dc +
             *(float *)&(shape0->super_btCollisionShape).m_userPointer * in_XMM1_Da +
             *(float *)((long)&(shape0->super_btCollisionShape).m_userPointer + 4) * in_XMM1_Db;
    auVar4._4_4_ = fVar21;
    auVar4._0_4_ = fVar20;
    auVar4._8_4_ = in_XMM1_Dc * (float)shape0[1].super_btCollisionShape.m_shapeType +
                   *(float *)&shape0[1].super_btCollisionShape._vptr_btCollisionShape * in_XMM1_Da +
                   *(float *)((long)&shape0[1].super_btCollisionShape._vptr_btCollisionShape + 4) *
                   in_XMM1_Db + (float)shape0[1].super_btCollisionShape.m_userIndex;
    auVar4._12_4_ = 0;
    *(undefined1 (*) [16])((wtrs0->m_basis).m_el[1].m_floats + 1) = auVar4;
    fVar13 = (wtrs0->m_basis).m_el[1].m_floats[3] - (wtrs0->m_basis).m_el[0].m_floats[3];
    bVar14 = btConvexShape::getMarginNonVirtual((btConvexShape *)position);
    bVar15 = btConvexShape::getMarginNonVirtual(&local_320.super_btConvexShape);
    fVar20 = fVar20 - fVar18;
    fVar21 = fVar21 - fVar19;
    fVar19 = bVar14 + bVar15;
    fVar18 = fVar13 * fVar13 + fVar20 * fVar20 + fVar21 * fVar21;
    if (fVar18 < 0.0) {
      fVar18 = sqrtf(fVar18);
    }
    else {
      fVar18 = SQRT(fVar18);
    }
    fVar17 = 1.0 / fVar18;
    auVar6._4_4_ = fVar21 * fVar17;
    auVar6._0_4_ = fVar20 * fVar17;
    auVar6._8_4_ = fVar13 * fVar17;
    auVar6._12_4_ = 0;
    *(undefined1 (*) [16])((wtrs0->m_basis).m_el[2].m_floats + 1) = auVar6;
    fVar13 = (wtrs0->m_basis).m_el[2].m_floats[3];
    fVar18 = fVar18 - fVar19;
    uVar16 = *(undefined8 *)((wtrs0->m_basis).m_el[0].m_floats + 1);
    *(ulong *)((wtrs0->m_basis).m_el[0].m_floats + 1) =
         CONCAT44((float)((ulong)uVar16 >> 0x20) + fVar19 * fVar21 * fVar17,
                  (float)uVar16 + fVar19 * fVar20 * fVar17);
    (wtrs0->m_basis).m_el[0].m_floats[3] = fVar13 * fVar19 + (wtrs0->m_basis).m_el[0].m_floats[3];
  }
  btConvexShape::~btConvexShape(&local_320.super_btConvexShape);
  return fVar18;
}

Assistant:

btScalar	btGjkEpaSolver2::SignedDistance(const btVector3& position,
											btScalar margin,
											const btConvexShape* shape0,
											const btTransform& wtrs0,
											sResults& results)
{
	tShape			shape;
	btSphereShape	shape1(margin);
	btTransform		wtrs1(btQuaternion(0,0,0,1),position);
	Initialize(shape0,wtrs0,&shape1,wtrs1,results,shape,false);
	GJK				gjk;	
	GJK::eStatus::_	gjk_status=gjk.Evaluate(shape,btVector3(1,1,1));
	if(gjk_status==GJK::eStatus::Valid)
	{
		btVector3	w0=btVector3(0,0,0);
		btVector3	w1=btVector3(0,0,0);
		for(U i=0;i<gjk.m_simplex->rank;++i)
		{
			const btScalar	p=gjk.m_simplex->p[i];
			w0+=shape.Support( gjk.m_simplex->c[i]->d,0)*p;
			w1+=shape.Support(-gjk.m_simplex->c[i]->d,1)*p;
		}
		results.witnesses[0]	=	wtrs0*w0;
		results.witnesses[1]	=	wtrs0*w1;
		const btVector3	delta=	results.witnesses[1]-
			results.witnesses[0];
		const btScalar	margin=	shape0->getMarginNonVirtual()+
			shape1.getMarginNonVirtual();
		const btScalar	length=	delta.length();	
		results.normal			=	delta/length;
		results.witnesses[0]	+=	results.normal*margin;
		return(length-margin);
	}
	else
	{
		if(gjk_status==GJK::eStatus::Inside)
		{
			if(Penetration(shape0,wtrs0,&shape1,wtrs1,gjk.m_ray,results))
			{
				const btVector3	delta=	results.witnesses[0]-
					results.witnesses[1];
				const btScalar	length=	delta.length();
				if (length >= SIMD_EPSILON)
					results.normal	=	delta/length;			
				return(-length);
			}
		}	
	}
	return(SIMD_INFINITY);
}